

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

Span * __thiscall tcmalloc::PageHeap::New(PageHeap *this,uint64_t n)

{
  uint64_t uVar1;
  bool bVar2;
  Span *pSVar3;
  uint64_t uVar4;
  
  std::mutex::lock(&this->lock);
  pSVar3 = SearchSmallAndLarge(this,n);
  if (pSVar3 == (Span *)0x0) {
    uVar4 = (this->stat).normal_bytes;
    if (((uVar4 != 0) && (uVar1 = (this->stat).returned_bytes, uVar1 != 0)) &&
       ((this->stat).system_bytes >> 2 < uVar1 + uVar4)) {
      uVar4 = ReleaseNormalSpans(this,0x7fffffff);
      if (uVar4 != 0) {
        pSVar3 = SearchSmallAndLarge(this,n);
        if (pSVar3 != (Span *)0x0) goto LAB_00104a83;
      }
    }
    bVar2 = GrowHeap(this,n);
    if (bVar2) {
      pSVar3 = SearchSmallAndLarge(this,n);
      if (pSVar3 != (Span *)0x0) goto LAB_00104a83;
    }
    pSVar3 = (Span *)0x0;
  }
  else {
LAB_00104a83:
    pSVar3 = Carve(this,pSVar3,n);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return pSVar3;
}

Assistant:

Span* New(uint64_t n) {
        std::lock_guard<std::mutex> guard(lock);
        Span* span = nullptr;
        span = SearchSmallAndLarge(n);
        if (span != nullptr) {
            return Carve(span, n);
        }

        // 没找到，但是有很多空闲内存，尝试合并碎片之后再找。
        if ( stat.normal_bytes != 0 && stat.returned_bytes != 0 &&
        (stat.normal_bytes + stat.returned_bytes) > (stat.system_bytes/4) &&
                (ReleaseNormalSpans(0x7fffffff) > 0) )
        {
            span = SearchSmallAndLarge(n);
            if (span != nullptr) {
                return Carve(span, n);
            }
        }

        if (GrowHeap(n)) {
            span = SearchSmallAndLarge(n);
            if (span != nullptr) {
                return Carve(span, n);
            }
        }
        return nullptr;
    }